

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::rehash
          (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this,size_t targetSize)

{
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> AVar1;
  HashBucket *local_40;
  HashBucket *local_38;
  Array<kj::_::HashBucket> local_30;
  size_t local_18;
  size_t targetSize_local;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this_local;
  
  local_18 = targetSize;
  targetSize_local = (size_t)this;
  AVar1 = kj::Array::operator_cast_to_ArrayPtr((Array *)&this->buckets);
  local_40 = AVar1.ptr;
  local_38 = (HashBucket *)AVar1.size_;
  AVar1.size_ = local_18;
  AVar1.ptr = local_38;
  kj::_::rehash(&local_30,(_ *)local_40,AVar1,in_R8);
  Array<kj::_::HashBucket>::operator=(&this->buckets,&local_30);
  Array<kj::_::HashBucket>::~Array(&local_30);
  this->erasedCount = 0;
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
    erasedCount = 0;
  }